

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.hpp
# Opt level: O0

void __thiscall MIDIplay::MIDIchannel::MIDIchannel(MIDIchannel *this)

{
  MIDIchannel *this_local;
  
  this->def_volume = 'd';
  this->def_bendsense_lsb = 0;
  this->def_bendsense_msb = 2;
  pl_list<MIDIplay::MIDIchannel::NoteInfo>::pl_list(&this->activenotes,0x80);
  this->gliding_note_count = 0;
  this->extended_note_count = 0;
  reset(this);
  return;
}

Assistant:

MIDIchannel() :
            def_volume(100),
            def_bendsense_lsb(0),
            def_bendsense_msb(2),
            activenotes(128)
        {
            gliding_note_count = 0;
            extended_note_count = 0;
            reset();
        }